

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O0

compile_errcode __thiscall VariableDefinition::Parse(VariableDefinition *this)

{
  char *pcVar1;
  LogTools *log_tools_ptr;
  bool bVar2;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  SymbolName local_20;
  undefined4 local_1c;
  SymbolName name;
  int state;
  VariableDefinition *this_local;
  
  local_1c = 0;
  _name = this;
  do {
    local_20 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    log_tools_ptr = g_log_tools;
    switch(local_1c) {
    case 0:
      bVar2 = IsValidVariableType(local_20);
      if (!bVar2) {
        return -1;
      }
      local_1c = 1;
      break;
    case 1:
      if (local_20 != IDENTIFIER_SYM) {
        pcVar1 = symbol_name_string[local_20];
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
        std::operator+(&local_40,"expected a valid identifier, but get a ",&local_60);
        GrammaErrorLogs(log_tools_ptr,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
        return -1;
      }
      local_1c = 2;
      break;
    case 2:
      if (local_20 == L_SQUARE_BRACKET_SYM) {
        local_1c = 0xb;
      }
      else if (local_20 == COMMA_SYM) {
        local_1c = 1;
      }
      else {
        if (local_20 != SEMICOLON_SYM) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_98,"expected a \'[\' or \',\' or \';\'",&local_99);
          GrammaErrorLogs(log_tools_ptr,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::allocator<char>::~allocator((allocator<char> *)&local_99);
          return 0;
        }
        local_1c = 3;
      }
      break;
    case 3:
      return 0;
    case 0xb:
      if (local_20 != INTERGER_SYM) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c0,"expected a valid identifier",&local_c1);
        GrammaErrorLogs(log_tools_ptr,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        return -1;
      }
      local_1c = 0xc;
      break;
    case 0xc:
      if (local_20 != R_SQUARE_BRACKET_SYM) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e8,"expected a \']\'",&local_e9);
        GrammaErrorLogs(log_tools_ptr,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
        return 0;
      }
      local_1c = 0xd;
      break;
    case 0xd:
      if (local_20 == COMMA_SYM) {
        local_1c = 1;
      }
      else {
        if (local_20 != SEMICOLON_SYM) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_110,"expected a \',\' or \';\'",&local_111);
          GrammaErrorLogs(log_tools_ptr,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::allocator<char>::~allocator((allocator<char> *)&local_111);
          return 0;
        }
        local_1c = 3;
      }
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
  } while( true );
}

Assistant:

compile_errcode VariableDefinition::Parse() {
    int state = 0;
    while (true) {
        SymbolName name = handle_symbol_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid identifier, but get a " + string(symbol_name_string[name]));
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == L_SQUARE_BRACKET_SYM) {
                    state = 11;
                    break;
                } else if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a '[' or ',' or ';'");
                    //return NOT_MATCH;
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
            case 3: return COMPILE_OK;
            case 11: {
                if (name == INTERGER_SYM) {
                    state = 12;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid identifier");
                    return NOT_MATCH;
                }
            }
            case 12: {
                if (name == R_SQUARE_BRACKET_SYM) {
                    state = 13;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ']'");
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
            case 13: {
                if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ',' or ';'");
                    // return NOT_MATCH;  // fault-tolerant
                    return COMPILE_OK;
                }
            }
        }
        handle_symbol_queue->NextSymbol();
    }
}